

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchar.cpp
# Opt level: O3

UBool u_isxdigit_63(UChar32 c)

{
  uint uVar1;
  ulong uVar2;
  
  if (c - 0x41U < 0x26 && c - 0x61U < 0xffffffe6) {
    return '\x01';
  }
  if (c - 0xff21U < 0x26 && c - 0xff41U < 0xffffffe6) {
    return '\x01';
  }
  if ((uint)c < 0xd800) {
    uVar1 = (uint)c >> 5;
  }
  else if ((uint)c < 0x10000) {
    uVar1 = ((uint)c >> 5) + 0x140;
    if (0xdbff < (uint)c) {
      uVar1 = (uint)c >> 5;
    }
  }
  else {
    uVar2 = 0x11f4;
    if (0x10ffff < (uint)c) goto LAB_002aac84;
    uVar1 = ((uint)c >> 5 & 0x3f) + (uint)propsTrie_index[(ulong)((uint)c >> 0xb) + 0x820];
  }
  uVar2 = (ulong)((c & 0x1fU) + (uint)propsTrie_index[uVar1] * 4);
LAB_002aac84:
  return (propsTrie_index[uVar2] & 0x1f) == 9;
}

Assistant:

U_CAPI UBool U_EXPORT2
u_isxdigit(UChar32 c) {
    uint32_t props;

    /* check ASCII and Fullwidth ASCII a-fA-F */
    if(
        (c<=0x66 && c>=0x41 && (c<=0x46 || c>=0x61)) ||
        (c>=0xff21 && c<=0xff46 && (c<=0xff26 || c>=0xff41))
    ) {
        return TRUE;
    }

    GET_PROPS(c, props);
    return (UBool)(GET_CATEGORY(props)==U_DECIMAL_DIGIT_NUMBER);
}